

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::AggregateMarking::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AggregateMarking *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Aggregate Marking:");
  poVar1 = std::operator<<(poVar1,"\n\tMaring Char Set:      ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(ushort)this->m_ui8AggregateMarkingCharacterSet);
  poVar1 = std::operator<<(poVar1,"\n\tMarking String:       ");
  GetAggregateMarkingString_abi_cxx11_(&local_1c0,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString AggregateMarking::GetAsString() const
{
    KStringStream ss;

    ss << "Aggregate Marking:"
       << "\n\tMaring Char Set:      " << ( KUINT16 )m_ui8AggregateMarkingCharacterSet
       << "\n\tMarking String:       " << GetAggregateMarkingString()
       << "\n";

    return ss.str();
}